

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_robertson_constraints.c
# Opt level: O2

int main(void)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  int iVar3;
  long *flagvalue;
  void *flagvalue_00;
  void *flagvalue_01;
  void *flagvalue_02;
  FILE *__s;
  long *plVar4;
  undefined8 uVar5;
  int iVar6;
  uint uVar7;
  bool bVar8;
  double dVar9;
  int flag;
  double local_c0;
  SUNContext ctx;
  sunrealtype t;
  FILE *local_a8;
  void *local_a0;
  void *arkode_mem;
  long netf;
  long ncfn;
  long nnf;
  long nni;
  long nfeLS;
  long nje;
  long nsetups;
  long nfi;
  long nfe;
  long nst_a;
  long nst;
  long nctf;
  
  arkode_mem = (void *)0x0;
  flag = SUNContext_Create(0,&ctx);
  iVar6 = 1;
  iVar3 = check_flag(&flag,"SUNContext_Create",1);
  if (iVar3 == 0) {
    puts("\nRobertson ODE test problem:");
    printf("    initial conditions:  u0 = %g,  v0 = %g,  w0 = %g\n",0,0,0);
    flagvalue = (long *)N_VNew_Serial(3,ctx);
    iVar3 = check_flag(flagvalue,"N_VNew_Serial",0);
    if (iVar3 == 0) {
      puVar1 = *(undefined8 **)(*flagvalue + 0x10);
      *puVar1 = 0x3ff0000000000000;
      puVar1[1] = 0;
      puVar1[2] = 0;
      flagvalue_00 = (void *)N_VClone(flagvalue);
      iVar3 = check_flag(flagvalue_00,"N_VNew_Serial",0);
      if (iVar3 == 0) {
        N_VConst(0,flagvalue_00);
        flagvalue_01 = (void *)ARKStepCreate(0,0,f,flagvalue,ctx);
        arkode_mem = flagvalue_01;
        iVar3 = check_flag(flagvalue_01,"ARKStepCreate",0);
        if (iVar3 == 0) {
          flag = ARKodeSetInitStep(0x9abcaf49,flagvalue_01);
          iVar3 = check_flag(&flag,"ARKodeSetInitStep",1);
          iVar6 = 1;
          if (iVar3 == 0) {
            flag = ARKodeSetMaxErrTestFails(flagvalue_01,0x14);
            iVar3 = check_flag(&flag,"ARKodeSetMaxErrTestFails",1);
            iVar6 = 1;
            if (iVar3 == 0) {
              flag = ARKodeSetMaxNonlinIters(flagvalue_01,8);
              iVar3 = check_flag(&flag,"ARKodeSetMaxNonlinIters",1);
              iVar6 = 1;
              if (iVar3 == 0) {
                flag = ARKodeSetNonlinConvCoef(0x9abcaf48,flagvalue_01);
                iVar3 = check_flag(&flag,"ARKodeSetNonlinConvCoef",1);
                iVar6 = 1;
                if (iVar3 == 0) {
                  flag = ARKodeSetMaxNumSteps(flagvalue_01,100000);
                  iVar3 = check_flag(&flag,"ARKodeSetMaxNumSteps",1);
                  iVar6 = 1;
                  if (iVar3 == 0) {
                    flag = ARKodeSetPredictorMethod(flagvalue_01,1);
                    iVar3 = check_flag(&flag,"ARKodeSetPredictorMethod",1);
                    iVar6 = 1;
                    if (iVar3 == 0) {
                      flag = ARKodeSStolerances(0xd2f1a9fc,0x3e7ad7f29abcaf48,flagvalue_01);
                      iVar3 = check_flag(&flag,"ARKodeSStolerances",1);
                      iVar6 = 1;
                      if (iVar3 == 0) {
                        flag = ARKodeSetConstraints(flagvalue_01,flagvalue_00);
                        iVar6 = 1;
                        iVar3 = check_flag(&flag,"ARKodeSetConstraints",1);
                        if (iVar3 == 0) {
                          flagvalue_02 = (void *)SUNDenseMatrix(3,3,ctx);
                          iVar3 = check_flag(flagvalue_02,"SUNDenseMatrix",0);
                          if (iVar3 == 0) {
                            local_a0 = (void *)SUNLinSol_Dense(flagvalue,flagvalue_02,ctx);
                            iVar3 = check_flag(local_a0,"SUNLinSol_Dense",0);
                            if (iVar3 == 0) {
                              flag = ARKodeSetLinearSolver(flagvalue_01,local_a0,flagvalue_02);
                              iVar3 = check_flag(&flag,"ARKodeSetLinearSolver",1);
                              iVar6 = 1;
                              if (iVar3 == 0) {
                                flag = ARKodeSetJacFn(flagvalue_01,Jac);
                                iVar3 = check_flag(&flag,"ARKodeSetJacFn",1);
                                iVar6 = 1;
                                if (iVar3 == 0) {
                                  __s = fopen("solution.txt","w");
                                  fwrite("# t u v w\n",10,1,__s);
                                  puVar1 = *(undefined8 **)(*flagvalue + 0x10);
                                  local_a8 = __s;
                                  fprintf(__s," %.16e %.16e %.16e %.16e\n",0,*puVar1,puVar1[1],
                                          puVar1[2]);
                                  t = 0.0;
                                  puts("        t           u           v           w");
                                  puts("   --------------------------------------------------");
                                  puVar1 = *(undefined8 **)(*flagvalue + 0x10);
                                  printf("  %10.3e  %12.5e  %12.5e  %12.5e\n",0,*puVar1,puVar1[1],
                                         puVar1[2]);
                                  iVar6 = 100;
                                  local_c0 = 1000000000.0;
                                  while (bVar8 = iVar6 != 0, iVar6 = iVar6 + -1, bVar8) {
                                    flag = ARKodeEvolve(SUB84(local_c0,0),flagvalue_01,flagvalue,&t,
                                                        1);
                                    iVar3 = check_flag(&flag,"ARKodeEvolve",1);
                                    if (iVar3 != 0) break;
                                    puVar1 = *(undefined8 **)(*flagvalue + 0x10);
                                    printf("  %10.3e  %12.5e  %12.5e  %12.5e\n",SUB84(t,0),*puVar1,
                                           puVar1[1],puVar1[2]);
                                    puVar1 = *(undefined8 **)(*flagvalue + 0x10);
                                    fprintf(local_a8," %.16e %.16e %.16e %.16e\n",SUB84(t,0),*puVar1
                                            ,puVar1[1],puVar1[2]);
                                    if (flag < 0) {
                                      fwrite("Solver failure, stopping integration\n",0x25,1,_stderr
                                            );
                                      break;
                                    }
                                    dVar9 = local_c0 + 1000000000.0;
                                    local_c0 = 100000000000.0;
                                    if (dVar9 <= 100000000000.0) {
                                      local_c0 = dVar9;
                                    }
                                  }
                                  puts("   --------------------------------------------------");
                                  fclose(local_a8);
                                  flag = ARKodeGetNumSteps(flagvalue_01,&nst);
                                  check_flag(&flag,"ARKodeGetNumSteps",1);
                                  flag = ARKodeGetNumStepAttempts(flagvalue_01,&nst_a);
                                  check_flag(&flag,"ARKodeGetNumStepAttempts",1);
                                  flag = ARKStepGetNumRhsEvals(flagvalue_01,&nfe,&nfi);
                                  check_flag(&flag,"ARKStepGetNumRhsEvals",1);
                                  flag = ARKodeGetNumLinSolvSetups(flagvalue_01,&nsetups);
                                  check_flag(&flag,"ARKodeGetNumLinSolvSetups",1);
                                  flag = ARKodeGetNumErrTestFails(flagvalue_01,&netf);
                                  check_flag(&flag,"ARKodeGetNumErrTestFails",1);
                                  flag = ARKodeGetNumStepSolveFails(flagvalue_01,&ncfn);
                                  check_flag(&flag,"ARKodeGetNumStepSolveFails",1);
                                  flag = ARKodeGetNumNonlinSolvIters(flagvalue_01,&nni);
                                  check_flag(&flag,"ARKodeGetNumNonlinSolvIters",1);
                                  flag = ARKodeGetNumNonlinSolvConvFails(flagvalue_01,&nnf);
                                  check_flag(&flag,"ARKodeGetNumNonlinSolvConvFails",1);
                                  flag = ARKodeGetNumJacEvals(flagvalue_01,&nje);
                                  check_flag(&flag,"ARKodeGetNumJacEvals",1);
                                  flag = ARKodeGetNumLinRhsEvals(flagvalue_01,&nfeLS);
                                  check_flag(&flag,"ARKodeGetNumLinRhsEvals",1);
                                  flag = ARKodeGetNumConstrFails(flagvalue_01);
                                  check_flag(&flag,"ARKodeGetNumConstrFails",1);
                                  puts("\nFinal Solver Statistics:");
                                  printf("   Internal solver steps = %li (attempted = %li)\n",nst,
                                         nst_a);
                                  printf("   Total RHS evals:  Fe = %li,  Fi = %li\n",nfe,nfi);
                                  printf("   Total linear solver setups = %li\n",nsetups);
                                  printf("   Total RHS evals for setting up the linear system = %li\n"
                                         ,nfeLS);
                                  printf("   Total number of Jacobian evaluations = %li\n",nje);
                                  printf("   Total number of Newton iterations = %li\n",nni);
                                  printf("   Total number of nonlinear solver convergence failures = %li\n"
                                         ,nnf);
                                  printf("   Total number of error test failures = %li\n",netf);
                                  printf("   Total number of constraint test failures = %li\n",nctf)
                                  ;
                                  printf("   Total number of failed steps from solver failure = %li\n"
                                         ,ncfn);
                                  plVar4 = (long *)N_VClone(flagvalue);
                                  uVar5 = N_VClone(flagvalue);
                                  puVar2 = *(undefined4 **)(*plVar4 + 0x10);
                                  *puVar2 = 0x6e615b42;
                                  puVar2[1] = 0x3e565ea4;
                                  puVar2[2] = 0x6bf402c4;
                                  puVar2[3] = 0x3d36ee95;
                                  *(undefined8 *)(puVar2 + 4) = 0x3feffffff4d0aac0;
                                  N_VAbs(plVar4,uVar5);
                                  N_VScale(0xd2f1a9fc,uVar5,uVar5);
                                  N_VAddConst(0x9abcaf48,uVar5,uVar5);
                                  dVar9 = (double)N_VMin(uVar5);
                                  if (dVar9 <= 0.0) {
                                    fwrite("\nSUNDIALS_ERROR: check_ans failed - ewt <= 0\n\n",0x2e,
                                           1,_stderr);
                                    uVar7 = 0xffffffff;
                                  }
                                  else {
                                    N_VInv(uVar5,uVar5);
                                    N_VLinearSum(0,0xbff0000000000000,flagvalue,plVar4,plVar4);
                                    dVar9 = (double)N_VWrmsNorm(plVar4,uVar5);
                                    local_c0 = (double)CONCAT71(local_c0._1_7_,1.0 <= dVar9);
                                    if (1.0 <= dVar9) {
                                      fprintf(_stdout,"\nSUNDIALS_WARNING: check_ans error=%g\n\n");
                                    }
                                    uVar7 = (uint)local_c0._0_1_;
                                    N_VDestroy(plVar4);
                                    N_VDestroy(uVar5);
                                  }
                                  flag = uVar7;
                                  N_VDestroy(flagvalue);
                                  N_VDestroy(flagvalue_00);
                                  ARKodeFree(&arkode_mem);
                                  SUNLinSolFree(local_a0);
                                  SUNMatDestroy(flagvalue_02);
                                  SUNContext_Free(&ctx);
                                  iVar6 = flag;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int main(void)
{
  sunrealtype ONE = SUN_RCONST(1.0);

  /* general problem parameters */
  sunrealtype T0    = SUN_RCONST(0.0);       /* initial time */
  sunrealtype Tf    = SUN_RCONST(1.e11);     /* final time */
  sunrealtype dTout = (Tf - T0) / 100;       /* time between outputs */
  int Nt            = (int)ceil(Tf / dTout); /* number of output times */
  sunindextype NEQ  = 3;                     /* number of dependent vars. */

  /* general problem variables */
  int flag;                    /* reusable error-checking flag */
  N_Vector y           = NULL; /* empty vector for storing solution */
  N_Vector constraints = NULL; /* empty vector for storing constraints */
  SUNMatrix A          = NULL; /* empty matrix for linear solver */
  SUNLinearSolver LS   = NULL; /* empty linear solver object */
  void* arkode_mem     = NULL; /* empty ARKode memory structure */
  FILE* UFID;
  sunrealtype t, tout;
  int iout;
  long int nst, nst_a, nfe, nfi, nsetups, nje, nfeLS, nni, nnf, ncfn, netf, nctf;

  /* set up the initial conditions, tolerances, initial time step size */
  sunrealtype u0     = SUN_RCONST(1.0);
  sunrealtype v0     = SUN_RCONST(0.0);
  sunrealtype w0     = SUN_RCONST(0.0);
  sunrealtype reltol = SUN_RCONST(1.0e-3);
  sunrealtype abstol = SUN_RCONST(1.0e-7);
  sunrealtype h0     = SUN_RCONST(1.0e-4) * reltol;

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(&flag, "SUNContext_Create", 1)) { return 1; }

  /* Initial problem output */
  printf("\nRobertson ODE test problem:\n");
  printf("    initial conditions:  u0 = %" GSYM ",  v0 = %" GSYM
         ",  w0 = %" GSYM "\n",
         u0, v0, w0);

  /* Initialize data structures */
  y = N_VNew_Serial(NEQ, ctx); /* Create serial vector for solution */
  if (check_flag((void*)y, "N_VNew_Serial", 0)) { return 1; }
  NV_Ith_S(y, 0) = u0; /* Set initial conditions into y */
  NV_Ith_S(y, 1) = v0;
  NV_Ith_S(y, 2) = w0;

  constraints = N_VClone(y);
  if (check_flag((void*)constraints, "N_VNew_Serial", 0)) { return 1; }
  /* Set constraints to all 1's for nonnegative solution values. */
  N_VConst(ONE, constraints);

  /* Call ARKStepCreate to initialize the ARK timestepper module and
     specify the right-hand side function in y'=f(t,y), the inital time
     T0, and the initial dependent variable vector y.  Note: since this
     problem is fully implicit, we set f_E to NULL and f_I to f. */
  arkode_mem = ARKStepCreate(NULL, f, T0, y, ctx);
  if (check_flag((void*)arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Set routines */
  flag = ARKodeSetInitStep(arkode_mem, h0); /* Set custom initial step */
  if (check_flag(&flag, "ARKodeSetInitStep", 1)) { return 1; }
  flag = ARKodeSetMaxErrTestFails(arkode_mem,
                                  20); /* Increase max error test fails */
  if (check_flag(&flag, "ARKodeSetMaxErrTestFails", 1)) { return 1; }
  flag = ARKodeSetMaxNonlinIters(arkode_mem, 8); /* Increase max nonlin iters  */
  if (check_flag(&flag, "ARKodeSetMaxNonlinIters", 1)) { return 1; }
  flag = ARKodeSetNonlinConvCoef(arkode_mem,
                                 SUN_RCONST(1.e-7)); /* Set nonlinear convergence coeff. */
  if (check_flag(&flag, "ARKodeSetNonlinConvCoef", 1)) { return 1; }
  flag = ARKodeSetMaxNumSteps(arkode_mem, 100000); /* Increase max num steps */
  if (check_flag(&flag, "ARKodeSetMaxNumSteps", 1)) { return 1; }
  flag = ARKodeSetPredictorMethod(arkode_mem,
                                  1); /* Specify maximum-order predictor */
  if (check_flag(&flag, "ARKodeSetPredictorMethod", 1)) { return 1; }
  flag = ARKodeSStolerances(arkode_mem, reltol, abstol); /* Specify tolerances */
  if (check_flag(&flag, "ARKodeSStolerances", 1)) { return 1; }
  flag = ARKodeSetConstraints(arkode_mem, constraints); /* Set constraints */
  if (check_flag(&flag, "ARKodeSetConstraints", 1)) { return 1; }

  /* Initialize dense matrix data structure and solver */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_flag((void*)A, "SUNDenseMatrix", 0)) { return 1; }
  LS = SUNLinSol_Dense(y, A, ctx);
  if (check_flag((void*)LS, "SUNLinSol_Dense", 0)) { return 1; }

  /* Linear solver interface */
  flag = ARKodeSetLinearSolver(arkode_mem, LS,
                               A); /* Attach matrix and linear solver */
  if (check_flag(&flag, "ARKodeSetLinearSolver", 1)) { return 1; }
  flag = ARKodeSetJacFn(arkode_mem, Jac); /* Set the Jacobian routine */
  if (check_flag(&flag, "ARKodeSetJacFn", 1)) { return 1; }

  /* Open output stream for results, output comment line */
  UFID = fopen("solution.txt", "w");
  fprintf(UFID, "# t u v w\n");

  /* output initial condition to disk */
  fprintf(UFID, " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n", T0,
          NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration, then
     prints results.  Stops when the final time has been reached */
  t    = T0;
  tout = T0 + dTout;
  printf("        t           u           v           w\n");
  printf("   --------------------------------------------------\n");
  printf("  %10.3" ESYM "  %12.5" ESYM "  %12.5" ESYM "  %12.5" ESYM "\n", t,
         NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
  for (iout = 0; iout < Nt; iout++)
  {
    flag = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL); /* call integrator */
    if (check_flag(&flag, "ARKodeEvolve", 1)) { break; }
    printf("  %10.3" ESYM "  %12.5" ESYM "  %12.5" ESYM "  %12.5" ESYM
           "\n", /* access/print solution */
           t, NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
    fprintf(UFID, " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n", t,
            NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
    if (flag >= 0)
    { /* successful solve: update time */
      tout += dTout;
      tout = (tout > Tf) ? Tf : tout;
    }
    else
    { /* unsuccessful solve: break */
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }
  }
  printf("   --------------------------------------------------\n");
  fclose(UFID);

  /* Print some final statistics */
  flag = ARKodeGetNumSteps(arkode_mem, &nst);
  check_flag(&flag, "ARKodeGetNumSteps", 1);
  flag = ARKodeGetNumStepAttempts(arkode_mem, &nst_a);
  check_flag(&flag, "ARKodeGetNumStepAttempts", 1);
  flag = ARKStepGetNumRhsEvals(arkode_mem, &nfe, &nfi);
  check_flag(&flag, "ARKStepGetNumRhsEvals", 1);
  flag = ARKodeGetNumLinSolvSetups(arkode_mem, &nsetups);
  check_flag(&flag, "ARKodeGetNumLinSolvSetups", 1);
  flag = ARKodeGetNumErrTestFails(arkode_mem, &netf);
  check_flag(&flag, "ARKodeGetNumErrTestFails", 1);
  flag = ARKodeGetNumStepSolveFails(arkode_mem, &ncfn);
  check_flag(&flag, "ARKodeGetNumStepSolveFails", 1);
  flag = ARKodeGetNumNonlinSolvIters(arkode_mem, &nni);
  check_flag(&flag, "ARKodeGetNumNonlinSolvIters", 1);
  flag = ARKodeGetNumNonlinSolvConvFails(arkode_mem, &nnf);
  check_flag(&flag, "ARKodeGetNumNonlinSolvConvFails", 1);
  flag = ARKodeGetNumJacEvals(arkode_mem, &nje);
  check_flag(&flag, "ARKodeGetNumJacEvals", 1);
  flag = ARKodeGetNumLinRhsEvals(arkode_mem, &nfeLS);
  check_flag(&flag, "ARKodeGetNumLinRhsEvals", 1);
  flag = ARKodeGetNumConstrFails(arkode_mem, &nctf);
  check_flag(&flag, "ARKodeGetNumConstrFails", 1);

  printf("\nFinal Solver Statistics:\n");
  printf("   Internal solver steps = %li (attempted = %li)\n", nst, nst_a);
  printf("   Total RHS evals:  Fe = %li,  Fi = %li\n", nfe, nfi);
  printf("   Total linear solver setups = %li\n", nsetups);
  printf("   Total RHS evals for setting up the linear system = %li\n", nfeLS);
  printf("   Total number of Jacobian evaluations = %li\n", nje);
  printf("   Total number of Newton iterations = %li\n", nni);
  printf("   Total number of nonlinear solver convergence failures = %li\n", nnf);
  printf("   Total number of error test failures = %li\n", netf);
  printf("   Total number of constraint test failures = %li\n", nctf);
  printf("   Total number of failed steps from solver failure = %li\n", ncfn);

  /* check the solution error */
  flag = check_ans(y, t, reltol, abstol);

  /* Clean up and return with successful completion */
  N_VDestroy(y);           /* Free y vector */
  N_VDestroy(constraints); /* Free constraints vector */
  ARKodeFree(&arkode_mem); /* Free integrator memory */
  SUNLinSolFree(LS);       /* Free linear solver */
  SUNMatDestroy(A);        /* Free A matrix */
  SUNContext_Free(&ctx);   /* Free context */

  return flag;
}